

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O0

rectangle * __thiscall dlib::drawable::get_rect(drawable *this)

{
  rmutex *in_RSI;
  rectangle *in_RDI;
  auto_mutex M;
  rectangle *prVar1;
  
  prVar1 = in_RDI;
  auto_mutex::auto_mutex((auto_mutex *)in_RDI,in_RSI);
  prVar1->l = *(long *)((long)&(in_RSI->m).myMutex + 8);
  prVar1->t = *(long *)((long)&(in_RSI->m).myMutex + 0x10);
  prVar1->r = (long)(in_RSI->m).myMutex.__data.__list.__prev;
  prVar1->b = (long)(in_RSI->m).myMutex.__data.__list.__next;
  auto_mutex::~auto_mutex((auto_mutex *)0x455afc);
  return in_RDI;
}

Assistant:

const rectangle get_rect (
        ) const 
        {
            auto_mutex M(m);
            return rect;
        }